

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall duckdb::BaseAppender::AppendDataChunk(BaseAppender *this,DataChunk *chunk_p)

{
  pointer pVVar1;
  pointer pVVar2;
  idx_t count;
  bool bVar3;
  long lVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  pointer pCVar8;
  InvalidInputException *pIVar9;
  pointer this_00;
  pointer rhs;
  unsigned_long params_1;
  size_type __n;
  vector<duckdb::LogicalType,_true> *types;
  string error_msg;
  DataChunk cast_chunk;
  vector<duckdb::LogicalType,_true> chunk_types;
  string local_108;
  undefined1 local_e8 [64];
  string local_a8;
  vector<duckdb::LogicalType,_true> local_88;
  string local_70;
  string local_50;
  
  DataChunk::GetTypes(&local_88,chunk_p);
  types = &this->active_types;
  if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    types = &this->types;
  }
  rhs = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start;
  lVar4 = (long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)rhs;
  this_00 = local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start == lVar4) {
    for (; this_00 !=
           local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar3 = LogicalType::operator==(this_00,rhs);
      if (!bVar3) {
        lVar4 = (long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        goto LAB_004bf842;
      }
      rhs = rhs + 1;
    }
    pCVar8 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    ColumnDataCollection::Append(pCVar8,chunk_p);
    pCVar8 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    if (this->flush_count <= pCVar8->count) {
      Flush(this);
    }
  }
  else {
LAB_004bf842:
    pVVar1 = (chunk_p->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = (chunk_p->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    params_1 = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (params_1 + (lVar4 >> 3) * 0x5555555555555555 != 0) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_e8._0_8_ = local_e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"incorrect column count in AppendDataChunk, expected %d, got %d"
                 ,"");
      InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (pIVar9,(string *)local_e8,
                 ((long)(types->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(types->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 params_1);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    count = chunk_p->count;
    DataChunk::DataChunk((DataChunk *)local_e8);
    DataChunk::Initialize((DataChunk *)local_e8,this->allocator,types,0x800);
    local_e8._24_8_ = count;
    if (pVVar2 != pVVar1) {
      __n = 0;
      do {
        pvVar5 = vector<duckdb::Vector,_true>::operator[](&chunk_p->data,__n);
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[](types,__n);
        bVar3 = LogicalType::operator==(&pvVar5->type,pvVar6);
        if (bVar3) {
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)local_e8,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk_p->data,__n);
          Vector::Reference(pvVar5,pvVar7);
        }
        else {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_108._M_string_length = 0;
          local_108.field_2._M_local_buf[0] = '\0';
          pvVar5 = vector<duckdb::Vector,_true>::operator[](&chunk_p->data,__n);
          pvVar7 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)local_e8,__n);
          bVar3 = VectorOperations::DefaultTryCast(pvVar5,pvVar7,count,&local_108,false);
          if (!bVar3) {
            pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,
                       "type mismatch in AppendDataChunk, expected %s, got %s for column %d","");
            pvVar6 = vector<duckdb::LogicalType,_true>::operator[](types,__n);
            LogicalType::ToString_abi_cxx11_(&local_50,pvVar6);
            pvVar5 = vector<duckdb::Vector,_true>::operator[](&chunk_p->data,__n);
            LogicalType::ToString_abi_cxx11_(&local_70,&pvVar5->type);
            InvalidInputException::
            InvalidInputException<std::__cxx11::string,std::__cxx11::string,unsigned_long>
                      (pIVar9,&local_a8,&local_50,&local_70,__n);
            __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
        }
        __n = __n + 1;
      } while (params_1 + (params_1 == 0) != __n);
    }
    pCVar8 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    ColumnDataCollection::Append(pCVar8,(DataChunk *)local_e8);
    pCVar8 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    if (this->flush_count <= pCVar8->count) {
      Flush(this);
    }
    DataChunk::~DataChunk((DataChunk *)local_e8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  return;
}

Assistant:

void BaseAppender::AppendDataChunk(DataChunk &chunk_p) {
	auto chunk_types = chunk_p.GetTypes();
	auto &appender_types = GetActiveTypes();

	// Early-out, if types match.
	if (chunk_types == appender_types) {
		collection->Append(chunk_p);
		if (collection->Count() >= flush_count) {
			Flush();
		}
		return;
	}

	auto count = chunk_p.ColumnCount();
	if (count != appender_types.size()) {
		throw InvalidInputException("incorrect column count in AppendDataChunk, expected %d, got %d",
		                            appender_types.size(), count);
	}

	// We try to cast the chunk.
	auto size = chunk_p.size();
	DataChunk cast_chunk;
	cast_chunk.Initialize(allocator, appender_types);
	cast_chunk.SetCardinality(size);

	for (idx_t i = 0; i < count; i++) {
		if (chunk_p.data[i].GetType() == appender_types[i]) {
			cast_chunk.data[i].Reference(chunk_p.data[i]);
			continue;
		}

		string error_msg;
		auto success = VectorOperations::DefaultTryCast(chunk_p.data[i], cast_chunk.data[i], size, &error_msg);
		if (!success) {
			throw InvalidInputException("type mismatch in AppendDataChunk, expected %s, got %s for column %d",
			                            appender_types[i].ToString(), chunk_p.data[i].GetType().ToString(), i);
		}
	}

	collection->Append(cast_chunk);
	if (collection->Count() >= flush_count) {
		Flush();
	}
}